

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_reader.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  KernelExecutionType KVar2;
  size_t sVar3;
  pointer __s2;
  KernelPerformanceInfo *pKVar4;
  size_t __n;
  uint64_t uVar5;
  pointer ppKVar6;
  pointer ppKVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  FILE *__stream;
  KernelPerformanceInfo *pKVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  undefined8 extraout_RAX;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  char *pcVar20;
  char cVar21;
  char *__end;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double local_b0;
  double local_a8;
  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  kernelInfo;
  ulong local_80;
  pointer local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  KernelPerformanceInfo *new_kernel;
  double fileExecuteTime;
  long local_38;
  
  if (argc == 1) {
    main_cold_1();
    if (kernelInfo.
        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(kernelInfo.
                      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)kernelInfo.
                            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)kernelInfo.
                            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (argc < 2) {
    local_80 = 0x20;
    bVar22 = true;
    iVar19 = 1;
  }
  else {
    iVar19 = 1;
    iVar10 = 0;
    cVar21 = ' ';
    do {
      if (*argv[iVar19] != '-') break;
      iVar9 = strcmp(argv[iVar19],"--delimiter");
      iVar18 = iVar19;
      if (iVar9 == 0) {
        iVar18 = iVar19 + 1;
        cVar21 = *argv[(long)iVar19 + 1];
      }
      iVar9 = strcmp(argv[iVar18],"--fixed-width");
      iVar19 = iVar18;
      if (iVar9 == 0) {
        iVar19 = iVar18 + 1;
        iVar10 = atoi(argv[(long)iVar18 + 1]);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < argc);
    bVar22 = iVar10 == 0;
    local_80 = (ulong)(uint)(int)cVar21;
  }
  kernelInfo.
  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  kernelInfo.
  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kernelInfo.
  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = 0.0;
  if (iVar19 < argc) {
    lVar14 = (long)iVar19;
    local_a8 = 0.0;
    do {
      local_38 = lVar14;
      __stream = fopen(argv[lVar14],"rb");
      fileExecuteTime = 0.0;
      fread(&fileExecuteTime,8,1,__stream);
      local_a8 = local_a8 + fileExecuteTime;
      iVar19 = feof(__stream);
      while (iVar19 == 0) {
        pKVar11 = (KernelPerformanceInfo *)operator_new(0x48);
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
        paVar12 = &(pKVar11->kernelName).field_2;
        (pKVar11->kernelName)._M_dataplus._M_p = (pointer)paVar12;
        if (local_68 == &local_58) {
          paVar12->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
          *(undefined8 *)((long)&(pKVar11->kernelName).field_2 + 8) = uStack_50;
        }
        else {
          (pKVar11->kernelName)._M_dataplus._M_p = local_68;
          (pKVar11->kernelName).field_2._M_allocated_capacity = CONCAT71(uStack_57,local_58);
        }
        (pKVar11->kernelName)._M_string_length = local_60;
        local_60 = 0;
        local_58 = '\0';
        pKVar11->timeSq = 0.0;
        pKVar11->startTime = 0.0;
        pKVar11->callCount = 0;
        pKVar11->time = 0.0;
        pKVar11->kType = PARALLEL_FOR;
        local_68 = &local_58;
        new_kernel = pKVar11;
        bVar8 = KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
                          (pKVar11,(FILE *)__stream);
        pKVar11 = new_kernel;
        ppKVar7 = kernelInfo.
                  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppKVar6 = kernelInfo.
                  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((bVar8) && (sVar3 = (new_kernel->kernelName)._M_string_length, sVar3 != 0)) {
          uVar16 = 0xffffffff;
          lVar14 = (long)kernelInfo.
                         super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)kernelInfo.
                         super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar14 != 0) {
            __s2 = (new_kernel->kernelName)._M_dataplus._M_p;
            uVar13 = 0;
            do {
              pKVar4 = ppKVar6[uVar13];
              __n = (pKVar4->kernelName)._M_string_length;
              uVar16 = (uint)uVar13;
              if ((__n == sVar3) &&
                 ((__n == 0 ||
                  (iVar19 = bcmp((pKVar4->kernelName)._M_dataplus._M_p,__s2,__n), iVar19 == 0))))
              goto LAB_00102628;
              uVar13 = (ulong)(uVar16 + 1);
            } while (uVar13 < (ulong)(lVar14 >> 3));
            uVar16 = 0xffffffff;
          }
LAB_00102628:
          if ((int)uVar16 < 0) {
            if (ppKVar7 ==
                kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>
              ::_M_realloc_insert<KokkosTools::KernelTimer::KernelPerformanceInfo*const&>
                        ((vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>
                          *)&kernelInfo,(iterator)ppKVar7,&new_kernel);
            }
            else {
              *ppKVar7 = pKVar11;
              kernelInfo.
              super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   kernelInfo.
                   super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            pKVar4 = ppKVar6[uVar16];
            dVar1 = pKVar11->time;
            pKVar4->time = pKVar4->time + dVar1;
            pKVar4->timeSq = dVar1 * dVar1 + pKVar4->timeSq;
            pKVar4->callCount = pKVar4->callCount + pKVar11->callCount;
          }
        }
        iVar19 = feof(__stream);
      }
      fclose(__stream);
      lVar14 = local_38 + 1;
    } while ((int)lVar14 != argc);
  }
  ppKVar7 = kernelInfo.
            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppKVar6 = kernelInfo.
            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar13 = (long)kernelInfo.
                   super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)kernelInfo.
                   super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    lVar14 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
              ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )kernelInfo.
                 super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )kernelInfo.
                 super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                )0x102c45);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
              ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )ppKVar6,
               (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )ppKVar7,
               (_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                )0x102c45);
  }
  if ((long)kernelInfo.
            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)kernelInfo.
            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    lVar14 = 0;
    local_b0 = 0.0;
  }
  else {
    local_b0 = 0.0;
    uVar13 = 0;
    lVar14 = 0;
    do {
      pKVar11 = kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13];
      if (pKVar11->kType != REGION) {
        local_b0 = local_b0 + pKVar11->time;
        lVar14 = lVar14 + pKVar11->callCount;
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 & 0xffffffff) <
             (ulong)((long)kernelInfo.
                           super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)kernelInfo.
                           super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  printf(
        " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in Kernels, %%Total Program Time\n"
        );
  puts("-------------------------------------------------------------------------\n");
  puts("Regions: \n");
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    uVar17 = 1;
    do {
      pKVar11 = kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13];
      if (pKVar11->kType == REGION) {
        uVar5 = pKVar11->callCount;
        auVar23._8_4_ = (int)(uVar5 >> 0x20);
        auVar23._0_8_ = uVar5;
        auVar23._12_4_ = 0x45300000;
        dVar1 = pKVar11->time;
        if (bVar22) {
          pcVar20 = "- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n";
          pcVar15 = " (REGION)  ";
        }
        else {
          pcVar20 = "- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n";
          pcVar15 = " (Region)  ";
        }
        printf(pcVar20,dVar1,
               dVar1 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)),
               (dVar1 / local_b0) * 100.0,(dVar1 / local_a8) * 100.0,
               (pKVar11->kernelName)._M_dataplus._M_p,pcVar15,local_80,local_80,uVar5,local_80,
               local_80,local_80);
      }
      bVar8 = uVar17 < (ulong)((long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar13 = uVar17;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (bVar8);
  }
  putchar(10);
  puts("-------------------------------------------------------------------------");
  puts("Kernels: \n");
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    uVar17 = 1;
    do {
      pKVar11 = kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13];
      uVar5 = pKVar11->callCount;
      auVar24._8_4_ = (int)(uVar5 >> 0x20);
      auVar24._0_8_ = uVar5;
      auVar24._12_4_ = 0x45300000;
      KVar2 = pKVar11->kType;
      if (KVar2 != REGION) {
        if (bVar22) {
          pcVar15 = " (ParFor)  ";
          if (KVar2 != PARALLEL_FOR) {
            if (KVar2 == PARALLEL_REDUCE) {
              pcVar15 = " (ParRed)  ";
            }
            else {
              pcVar15 = " (REGION)  ";
              if (KVar2 == PARALLEL_SCAN) {
                pcVar15 = " (ParScan) ";
              }
            }
          }
          dVar1 = pKVar11->time;
          pcVar20 = "- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n";
        }
        else {
          pcVar15 = " (ParFor)  ";
          if (KVar2 != PARALLEL_FOR) {
            if (KVar2 == PARALLEL_REDUCE) {
              pcVar15 = " (ParRed)  ";
            }
            else {
              pcVar15 = " (Region)  ";
              if (KVar2 == PARALLEL_SCAN) {
                pcVar15 = " (ParScan) ";
              }
            }
          }
          dVar1 = pKVar11->time;
          pcVar20 = "- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n";
        }
        printf(pcVar20,dVar1,
               dVar1 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)),
               (dVar1 / local_b0) * 100.0,(dVar1 / local_a8) * 100.0,
               (pKVar11->kernelName)._M_dataplus._M_p,pcVar15,local_80,local_80,uVar5,local_80,
               local_80,local_80);
      }
      bVar8 = uVar17 < (ulong)((long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar13 = uVar17;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (bVar8);
  }
  putchar(10);
  puts("-------------------------------------------------------------------------");
  puts("Summary:");
  putchar(10);
  printf("Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",local_a8);
  printf("Total Time in Kokkos kernels:                          %20.5f seconds\n",local_b0);
  printf("   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
         local_a8 - local_b0);
  printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
         (local_b0 / local_a8) * 100.0);
  printf("Total Calls to Kokkos Kernels:                         %20lu\n",lVar14);
  putchar(10);
  puts("-------------------------------------------------------------------------");
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(kernelInfo.
                    super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)kernelInfo.
                          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)kernelInfo.
                          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc == 1) {
    fprintf(stderr, "Did you specify any data files on the command line!\n");
    fprintf(stderr, "Usage: ./reader file1.dat [fileX.dat]*\n");
    exit(-1);
  }

  char delimiter  = ' ';
  int fixed_width = 0;

  int commandline_args = 1;
  while ((commandline_args < argc) && (argv[commandline_args][0] == '-')) {
    if (strcmp(argv[commandline_args], "--delimiter") == 0) {
      delimiter = argv[++commandline_args][0];
    }
    if (strcmp(argv[commandline_args], "--fixed-width") == 0) {
      fixed_width = atoi(argv[++commandline_args]);
    }

    commandline_args++;
  }

  std::vector<KernelPerformanceInfo*> kernelInfo;
  double totalKernelsTime    = 0;
  double totalExecuteTime    = 0;
  uint64_t totalKernelsCalls = 0;

  for (int i = commandline_args; i < argc; i++) {
    FILE* the_file = fopen(argv[i], "rb");

    double fileExecuteTime = 0;
    fread(&fileExecuteTime, sizeof(fileExecuteTime), 1, the_file);

    totalExecuteTime += fileExecuteTime;

    while (!feof(the_file)) {
      KernelPerformanceInfo* new_kernel =
          new KernelPerformanceInfo("", PARALLEL_FOR);
      if (new_kernel->readFromFile(the_file)) {
        if (!new_kernel->getName().empty()) {
          int kernelIndex = find_index(kernelInfo, new_kernel->getName());

          if (kernelIndex > -1) {
            kernelInfo[kernelIndex]->addTime(new_kernel->getTime());
            kernelInfo[kernelIndex]->addCallCount(new_kernel->getCallCount());
          } else {
            kernelInfo.push_back(new_kernel);
          }
        }
      }
    }

    fclose(the_file);
  }

  std::sort(kernelInfo.begin(), kernelInfo.end(), compareKernelPerformanceInfo);

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    if (kernelInfo[i]->getKernelType() != REGION) {
      totalKernelsTime += kernelInfo[i]->getTime();
      totalKernelsCalls += kernelInfo[i]->getCallCount();
    }
  }

  printf(
      " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in "
      "Kernels, %%Total Program Time\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n\n");

  printf("Regions: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() != REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Kernels: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() == REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Summary:\n");
  printf("\n");
  printf(
      "Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",
      totalExecuteTime);
  printf(
      "Total Time in Kokkos kernels:                          %20.5f seconds\n",
      totalKernelsTime);
  printf(
      "   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
      (totalExecuteTime - totalKernelsTime));
  printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
         (totalKernelsTime / totalExecuteTime) * 100);
  printf("Total Calls to Kokkos Kernels:                         %20" PRIu64
         "\n",
         totalKernelsCalls);
  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");

  return 0;
}